

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O1

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CBinopExpression *expression)

{
  undefined8 uVar1;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> _Var2;
  TOperationType TVar3;
  CExpression *pCVar4;
  CEseqExpression *pCVar5;
  long lVar6;
  CBinopExpression *pCVar7;
  CStatement *pCVar8;
  CExpression *pCVar9;
  CEseqExpression *rightEseq;
  pointer *__ptr;
  pointer_____offset_0x10___ *binop;
  undefined1 local_88 [16];
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_78;
  _Head_base<0UL,_const_IRT::CExpressionList_*,_false> local_70;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_68;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_60;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_58;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_50;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_48;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_40;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_38;
  
  pCVar4 = CBinopExpression::getLeftOperand(expression);
  (**(pCVar4->super_IExpression).super_INode._vptr_INode)(pCVar4,this);
  rightEseq = (CEseqExpression *)
              (this->childExpression)._M_t.
              super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
              .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  pCVar4 = CBinopExpression::getRightOperand(expression);
  binop = (pointer_____offset_0x10___ *)this;
  (**(pCVar4->super_IExpression).super_INode._vptr_INode)(pCVar4);
  pCVar4 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  if (rightEseq == (CEseqExpression *)0x0) {
    pCVar5 = (CEseqExpression *)0x0;
  }
  else {
    binop = &CExpression::typeinfo;
    pCVar5 = (CEseqExpression *)
             __dynamic_cast(rightEseq,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  if (pCVar4 == (CExpression *)0x0) {
    lVar6 = 0;
  }
  else {
    binop = &CExpression::typeinfo;
    lVar6 = __dynamic_cast(pCVar4,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  if (pCVar5 == (CEseqExpression *)0x0 && lVar6 == 0) {
    pCVar7 = (CBinopExpression *)operator_new(0x20);
    local_50._M_head_impl = pCVar4;
    local_38._M_head_impl = (CExpression *)rightEseq;
    TVar3 = CBinopExpression::getOperation(expression);
    CBinopExpression::CBinopExpression
              (pCVar7,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_38,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_50,TVar3);
    pCVar4 = (this->childExpression)._M_t.
             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (this->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)pCVar7;
    if (pCVar4 != (CExpression *)0x0) {
      (**(code **)((long)(pCVar4->super_IExpression).super_INode + 0x10))();
    }
    if (local_50._M_head_impl != (CExpression *)0x0) {
      (*((local_50._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_50._M_head_impl = (CExpression *)0x0;
    if ((CEseqExpression *)local_38._M_head_impl != (CEseqExpression *)0x0) {
      (*(((CExpression *)&(local_38._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_38._M_head_impl = (CExpression *)0x0;
    rightEseq = (CEseqExpression *)0x0;
LAB_00137184:
    pCVar4 = (CExpression *)0x0;
  }
  else {
    if ((pCVar5 == (CEseqExpression *)0x0) && (lVar6 != 0)) {
      processRightEseqInCBinop
                ((CEseqFloatVisitor *)local_88,(CBinopExpression *)binop,
                 &expression->super_CExpression,rightEseq);
      uVar1 = local_88._0_8_;
      local_88._0_8_ = (CExpression *)0x0;
      pCVar9 = (this->childExpression)._M_t.
               super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
               .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
      (this->childExpression)._M_t.
      super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
      _M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)uVar1;
    }
    else {
      if ((pCVar5 != (CEseqExpression *)0x0) && (lVar6 == 0)) {
        local_78._M_head_impl = (CExpression *)operator_new(0x18);
        pCVar8 = CEseqExpression::getStatement(pCVar5);
        (*(pCVar8->super_IStatement).super_INode._vptr_INode[3])(local_88,pCVar8);
        local_58._M_head_impl = (CExpression *)local_88._0_8_;
        local_88._0_8_ = (CExpression *)0x0;
        pCVar7 = (CBinopExpression *)operator_new(0x20);
        pCVar9 = CEseqExpression::getExpression(pCVar5);
        (*(pCVar9->super_IExpression).super_INode._vptr_INode[3])(local_88 + 8,pCVar9);
        local_60._M_head_impl = (CExpression *)local_88._8_8_;
        local_88._8_8_ =
             (__uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>)
             0x0;
        local_68._M_head_impl = pCVar4;
        TVar3 = CBinopExpression::getOperation(expression);
        CBinopExpression::CBinopExpression
                  (pCVar7,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                           *)&local_60,
                   (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                    *)&local_68,TVar3);
        _Var2._M_head_impl = local_78._M_head_impl;
        local_40._M_head_impl = (CExpression *)pCVar7;
        CEseqExpression::CEseqExpression
                  ((CEseqExpression *)local_78._M_head_impl,
                   (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *
                   )&local_58,
                   (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                    *)&local_40);
        pCVar4 = (this->childExpression)._M_t.
                 super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                 .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
        (this->childExpression)._M_t.
        super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
        .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
        if (pCVar4 != (CExpression *)0x0) {
          (**(code **)((long)(pCVar4->super_IExpression).super_INode + 0x10))();
        }
        if ((CBinopExpression *)local_40._M_head_impl != (CBinopExpression *)0x0) {
          (*(((CExpression *)&(local_40._M_head_impl)->super_IExpression)->super_IExpression).
            super_INode._vptr_INode[2])();
        }
        local_40._M_head_impl = (CExpression *)0x0;
        if (local_68._M_head_impl != (CExpression *)0x0) {
          (*((local_68._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
        }
        local_68._M_head_impl = (CExpression *)0x0;
        if (local_60._M_head_impl != (CExpression *)0x0) {
          (*(((IStatement *)&(local_60._M_head_impl)->super_IExpression)->super_INode)._vptr_INode
            [2])();
        }
        local_60._M_head_impl = (CExpression *)0x0;
        if ((_Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>)
            local_88._8_8_ != (CStatement *)0x0) {
          (**(code **)((long)*(IStatement *)local_88._8_8_ + 0x10))();
        }
        if (local_58._M_head_impl != (CExpression *)0x0) {
          (*((local_58._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
        }
        local_58._M_head_impl = (CExpression *)0x0;
        if ((CExpression *)local_88._0_8_ != (CExpression *)0x0) {
          (**(code **)((long)*(IExpression *)local_88._0_8_ + 0x10))();
        }
        goto LAB_00137184;
      }
      if ((pCVar5 == (CEseqExpression *)0x0) || (lVar6 == 0)) goto LAB_001371c3;
      local_78._M_head_impl = (CExpression *)operator_new(0x18);
      pCVar7 = (CBinopExpression *)CEseqExpression::getStatement(pCVar5);
      (*(pCVar7->super_CExpression).super_IExpression.super_INode._vptr_INode[3])(local_88);
      local_70._M_head_impl = (CExpressionList *)local_88._0_8_;
      local_88._0_8_ = (CExpression *)0x0;
      pCVar5 = (CEseqExpression *)CEseqExpression::getExpression(pCVar5);
      processRightEseqInCBinop
                ((CEseqFloatVisitor *)(local_88 + 8),pCVar7,&expression->super_CExpression,pCVar5);
      _Var2._M_head_impl = local_78._M_head_impl;
      local_48._M_head_impl = (CExpression *)local_88._8_8_;
      local_88._8_8_ = (CStatement *)0x0;
      CEseqExpression::CEseqExpression
                ((CEseqExpression *)local_78._M_head_impl,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_70,
                 (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *
                 )&local_48);
      pCVar9 = (this->childExpression)._M_t.
               super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
               .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
      (this->childExpression)._M_t.
      super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>.
      _M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (pCVar9 != (CExpression *)0x0) {
        (**(code **)((long)(pCVar9->super_IExpression).super_INode + 0x10))();
      }
      if (local_48._M_head_impl != (CExpression *)0x0) {
        (*(((IStatement *)&(local_48._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])
                  ();
      }
      local_48._M_head_impl = (CExpression *)0x0;
      if (local_70._M_head_impl != (CExpressionList *)0x0) {
        (*((local_70._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
      }
      local_70._M_head_impl = (CExpressionList *)0x0;
      pCVar9 = (CExpression *)local_88._0_8_;
    }
    if (pCVar9 != (CExpression *)0x0) {
      (*(pCVar9->super_IExpression).super_INode._vptr_INode[2])();
    }
  }
LAB_001371c3:
  if (pCVar4 != (CExpression *)0x0) {
    (*(pCVar4->super_IExpression).super_INode._vptr_INode[2])(pCVar4);
  }
  if (rightEseq != (CEseqExpression *)0x0) {
    (*(rightEseq->super_CExpression).super_IExpression.super_INode._vptr_INode[2])(rightEseq);
  }
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CBinopExpression &expression) {
    expression.getLeftOperand()->Accept(*this);
    std::unique_ptr<const CExpression> left = std::move(childExpression);

    expression.getRightOperand()->Accept(*this);
    std::unique_ptr<const CExpression> right = std::move(childExpression);

    const CEseqExpression* leftEseq = dynamic_cast<const CEseqExpression*>(left.get());
    const CEseqExpression* rightEseq = dynamic_cast<const CEseqExpression*>(right.get());

    if (leftEseq == nullptr && rightEseq == nullptr) {
        childExpression = EMOVE_UNIQ(new CBinopExpression(
                std::move(left),
                std::move(right),
                expression.getOperation()
        ));

        return;
    }

    if (leftEseq == nullptr && rightEseq != nullptr) {
        childExpression = std::move(processRightEseqInCBinop(&expression, left.get(), rightEseq));

        return;
    }

    if (leftEseq != nullptr && rightEseq == nullptr) {
        childExpression = EMOVE_UNIQ(new CEseqExpression(
                std::move(leftEseq->getStatement()->Copy()),
                EMOVE_UNIQ(new CBinopExpression(
                        std::move(leftEseq->getExpression()->Copy()),
                        std::move(right),
                        expression.getOperation()
                ))
        ));


        return;
    }

    if (leftEseq != nullptr && rightEseq != nullptr) {
        childExpression = EMOVE_UNIQ(new CEseqExpression(
                std::move(leftEseq->getStatement()->Copy()),
                std::move(processRightEseqInCBinop(&expression, leftEseq->getExpression(), rightEseq))
        ));

        return;
    }
}